

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_column.h
# Opt level: O2

Unordered_set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_false>_>_>
* __thiscall
Gudhi::persistence_matrix::
Unordered_set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_false>_>_>
::operator*=(Unordered_set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_false>_>_>
             *this,uint v)

{
  uint uVar1;
  _Hash_node_base entry;
  __node_base *p_Var2;
  
  uVar1 = this->operators_->characteristic_;
  if (uVar1 <= v) {
    v = v % uVar1;
  }
  if (v != 1) {
    if (v == 0) {
      clear(this);
    }
    else {
      p_Var2 = &(this->column_)._M_h._M_before_begin;
      while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
        entry._M_nxt = p_Var2[1]._M_nxt;
        persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
                  (this->operators_,
                   (Element *)((Entry_column_index_option *)&(entry._M_nxt)->_M_nxt + 1),v);
        Row_access<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_false>_>_>
        ::update_entry(&this->super_Row_access_option,(Matrix_entry *)entry._M_nxt);
      }
    }
  }
  return this;
}

Assistant:

inline Unordered_set_column<Master_matrix>& Unordered_set_column<Master_matrix>::operator*=(unsigned int v)
{
  if constexpr (Master_matrix::Option_list::is_z2) {
    if (v % 2 == 0) {
      if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
        throw std::invalid_argument("A chain column should not be multiplied by 0.");
      } else {
        clear();
      }
    }
  } else {
    Field_element val = operators_->get_value(v);

    if (val == Field_operators::get_additive_identity()) {
      if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
        throw std::invalid_argument("A chain column should not be multiplied by 0.");
      } else {
        clear();
      }
      return *this;
    }

    if (val == Field_operators::get_multiplicative_identity()) return *this;

    for (Entry* entry : column_) {
      operators_->multiply_inplace(entry->get_element(), val);
      if constexpr (Master_matrix::Option_list::has_row_access) RA_opt::update_entry(*entry);
    }
  }

  return *this;
}